

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RandomDelayFilterOperation::setString
          (RandomDelayFilterOperation *this,string_view property,string_view val)

{
  string_view timeString;
  string_view timeString_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  bool bVar1;
  pointer ppVar2;
  pointer pRVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  double dVar4;
  TimeRepresentation<count_time<9,_long>_> time_1;
  TimeRepresentation<count_time<9,_long>_> time;
  const_iterator res;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
  *in_stack_fffffffffffffe38;
  atomic<double> *paVar5;
  size_t in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  _Self local_78;
  _Self local_70 [3];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_fffffffffffffe48);
  __x._M_str = in_stack_fffffffffffffe70;
  __x._M_len = in_stack_fffffffffffffe68;
  __y._M_str = in_stack_fffffffffffffe60;
  __y._M_len = in_stack_fffffffffffffe58;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    local_58 = local_10;
    local_50 = local_8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_fffffffffffffe48);
    __x_00._M_str = in_stack_fffffffffffffe70;
    __x_00._M_len = in_stack_fffffffffffffe68;
    __y_00._M_str = in_stack_fffffffffffffe60;
    __y_00._M_len = in_stack_fffffffffffffe58;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDI,in_stack_fffffffffffffe48);
      __x_01._M_str = in_stack_fffffffffffffe70;
      __x_01._M_len = in_stack_fffffffffffffe68;
      __y_01._M_str = in_stack_fffffffffffffe60;
      __y_01._M_len = in_stack_fffffffffffffe58;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_RDI,in_stack_fffffffffffffe48);
        __x_02._M_str = in_stack_fffffffffffffe70;
        __x_02._M_len = in_stack_fffffffffffffe68;
        __y_02._M_str = in_stack_fffffffffffffe60;
        __y_02._M_len = in_stack_fffffffffffffe58;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_RDI,in_stack_fffffffffffffe48);
          __x_03._M_str = in_stack_fffffffffffffe70;
          __x_03._M_len = in_stack_fffffffffffffe68;
          __y_03._M_str = in_stack_fffffffffffffe60;
          __y_03._M_len = in_stack_fffffffffffffe58;
          bVar1 = std::operator==(__x_03,__y_03);
          if (!bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_RDI,in_stack_fffffffffffffe48);
            __x_04._M_str = in_stack_fffffffffffffe70;
            __x_04._M_len = in_stack_fffffffffffffe68;
            __y_04._M_str = in_stack_fffffffffffffe60;
            __y_04._M_len = in_stack_fffffffffffffe58;
            bVar1 = std::operator==(__x_04,__y_04);
            if (!bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_RDI,in_stack_fffffffffffffe48);
              __x_05._M_str = in_stack_fffffffffffffe70;
              __x_05._M_len = in_stack_fffffffffffffe68;
              __y_05._M_str = in_stack_fffffffffffffe60;
              __y_05._M_len = in_stack_fffffffffffffe58;
              bVar1 = std::operator==(__x_05,__y_05);
              if (!bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_RDI,in_stack_fffffffffffffe48);
                __x_06._M_str = in_stack_fffffffffffffe70;
                __x_06._M_len = in_stack_fffffffffffffe68;
                __y_06._M_str = in_stack_fffffffffffffe60;
                __y_06._M_len = in_stack_fffffffffffffe58;
                bVar1 = std::operator==(__x_06,__y_06);
                if (!bVar1) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_RDI,in_stack_fffffffffffffe48);
                  __x_07._M_str = in_stack_fffffffffffffe70;
                  __x_07._M_len = in_stack_fffffffffffffe68;
                  __y_07._M_str = in_stack_fffffffffffffe60;
                  __y_07._M_len = in_stack_fffffffffffffe58;
                  bVar1 = std::operator==(__x_07,__y_07);
                  if (!bVar1) {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_RDI,in_stack_fffffffffffffe48);
                    __x_08._M_str = in_stack_fffffffffffffe70;
                    __x_08._M_len = in_stack_fffffffffffffe68;
                    __y_08._M_str = in_stack_fffffffffffffe60;
                    __y_08._M_len = in_stack_fffffffffffffe58;
                    bVar1 = std::operator==(__x_08,__y_08);
                    if (!bVar1) {
                      return;
                    }
                  }
                }
              }
              timeString_00._M_str = in_stack_fffffffffffffe48;
              timeString_00._M_len = in_stack_fffffffffffffe40;
              gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        (timeString_00);
              pRVar3 = std::
                       unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                       ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                                     *)0x2d88dc);
              paVar5 = &pRVar3->param2;
              dVar4 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x2d88ee);
              std::__atomic_float<double>::store
                        (&paVar5->super___atomic_float<double>,dVar4,seq_cst);
              return;
            }
          }
        }
      }
      timeString._M_str = in_stack_fffffffffffffe48;
      timeString._M_len = in_stack_fffffffffffffe40;
      gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>(timeString);
      pRVar3 = std::
               unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
               ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                             *)0x2d8728);
      paVar5 = &pRVar3->param1;
      dVar4 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x2d873e);
      std::__atomic_float<double>::store(&paVar5->super___atomic_float<double>,dVar4,seq_cst);
      return;
    }
  }
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
       ::find(in_stack_fffffffffffffe38,(key_type *)0x2d84ef);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
       ::end(in_stack_fffffffffffffe38);
  bVar1 = std::operator==(local_70,&local_78);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pRVar3 = std::
             unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
             ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                           *)0x2d8536);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>
                           *)0x2d8548);
    std::atomic<helics::RandomDistributions>::store(&pRVar3->dist,ppVar2->second,seq_cst);
  }
  return;
}

Assistant:

void RandomDelayFilterOperation::setString(std::string_view property, std::string_view val)
{
    if ((property == "dist") || (property == "distribution")) {
        auto res = distMap.find(val);
        if (res != distMap.end()) {
            rdelayGen->dist.store(res->second);
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param1.store(static_cast<double>(time));
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param2.store(static_cast<double>(time));
    }
}